

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::test_script_parsing::test_method(test_script_parsing *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  readonly_property65 rVar7;
  bool bVar8;
  int iVar9;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  Span<const_char> SVar12;
  string_view separators;
  string_view separators_00;
  string_view separators_01;
  string_view separators_02;
  check_type cVar13;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 local_554 [20];
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 local_170 [16];
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  Span<const_char> local_100;
  char *local_f0;
  assertion_result local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char **local_c0;
  char *local_b8;
  assertion_result local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string input;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  pvVar10 = (iterator)0xe;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,0,"MilkToastHoney",0xe);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x732c4f;
  file.m_end = (iterator)0x524;
  file.m_begin = (iterator)&local_110;
  msg.m_end = in_R9;
  msg.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_48._8_8_ = local_170;
  local_170._0_8_ = "success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_128 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_130,0x524);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x525;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"MilkToastHoney");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_48._8_8_ = &local_c8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  local_f0 = "MilkToastHoney";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae208;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x525,
             (lazy_ostream *)local_58,"\"MilkToastHoney\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Milk","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x732f36;
  file_01.m_end = (iterator)0x528;
  file_01.m_begin = (iterator)&local_180;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190,
             msg_01);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_198 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_1a0,0x528);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x529;
  file_02.m_begin = (iterator)&local_1b0;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c0,
             msg_02);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"ToastHoney");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "ToastHoney";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013af6f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x529,
             (lazy_ostream *)local_58,"\"ToastHoney\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Bread","");
  bVar8 = ::script::Const((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x73322e;
  file_03.m_end = (iterator)0x52c;
  file_03.m_begin = (iterator)&local_1d0;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
             msg_03);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "!success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1e8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_1f0,0x52c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Toast","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x733352;
  file_04.m_end = (iterator)0x52f;
  file_04.m_begin = (iterator)&local_200;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
             msg_04);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_218 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_220,0x52f);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x530;
  file_05.m_begin = (iterator)&local_230;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_240,
             msg_05);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"Honey");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "Honey";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae618;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x530,
             (lazy_ostream *)local_58,"\"Honey\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Honeybadger","");
  bVar8 = ::script::Const((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x73364d;
  file_06.m_end = (iterator)0x533;
  file_06.m_begin = (iterator)&local_250;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_260,
             msg_06);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "!success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_268 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_270,0x533);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Honey","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Const((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x733771;
  file_07.m_end = (iterator)0x536;
  file_07.m_begin = (iterator)&local_280;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_290,
             msg_07);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_298 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_2a0,0x536);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x537;
  file_08.m_begin = (iterator)&local_2b0;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c0,
             msg_08);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x537,
             (lazy_ostream *)local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"Foo(Bar(xy,z()))",0x10);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"FooBar","");
  bVar8 = ::script::Func((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x733a95;
  file_09.m_end = (iterator)0x53e;
  file_09.m_begin = (iterator)&local_2d0;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2e0,
             msg_09);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "!success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2e8 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_2f0,0x53e);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Foo(","");
  bVar8 = ::script::Func((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x733bb9;
  file_10.m_end = (iterator)0x541;
  file_10.m_begin = (iterator)&local_300;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_310,
             msg_10);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "!success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_318 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_320,0x541);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Foo","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Func((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x733cdd;
  file_11.m_end = (iterator)0x544;
  file_11.m_begin = (iterator)&local_330;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_340,
             msg_11);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_348 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_350,0x544);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x545;
  file_12.m_begin = (iterator)&local_360;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_370,
             msg_12);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"Bar(xy,z())");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "Bar(xy,z())";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013af8f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x545,
             (lazy_ostream *)local_58,"\"Bar(xy,z())\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Bar","");
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::script::Func((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x733fe0;
  file_13.m_end = (iterator)0x548;
  file_13.m_begin = (iterator)&local_380;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_390,
             msg_13);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_398 = "";
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_3a0,0x548);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x549;
  file_14.m_begin = (iterator)&local_3b0;
  msg_14.m_end = pvVar11;
  msg_14.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c0,
             msg_14);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"xy,z()");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "xy,z()";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae188;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x549,
             (lazy_ostream *)local_58,"\"xy,z()\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"xy","");
  bVar8 = ::script::Func((string *)local_58,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar13 = 0x7342d6;
  file_15.m_end = (iterator)0x54c;
  file_15.m_begin = (iterator)&local_3d0;
  msg_15.m_end = pvVar11;
  msg_15.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3e0,
             msg_15);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar8;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170._0_8_ = "!success";
  local_170._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3e8 = "";
  pvVar11 = (iterator)0x0;
  local_48._8_8_ = (lazy_ostream *)local_170;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_58,1,0,WARN,_cVar13,(size_t)&local_3f0,0x54c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  pvVar10 = (iterator)0xb;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"(n*(n-1))/2",0xb);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_100);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x554;
  file_16.m_begin = (iterator)&local_400;
  msg_16.m_end = pvVar11;
  msg_16.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_410,
             msg_16);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"(n*(n-1))/2");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "(n*(n-1))/2";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013af8f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79d23,(size_t)&local_c0,0x554,
             (lazy_ostream *)local_58,"\"(n*(n-1))/2\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x555;
  file_17.m_begin = (iterator)&local_420;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_430,
             msg_17);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x555,
             (lazy_ostream *)local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x7;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"foo,bar",7);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_100);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x55a;
  file_18.m_begin = (iterator)&local_440;
  msg_18.m_end = pvVar10;
  msg_18.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_450,
             msg_18);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"foo");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "foo";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae898;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79d23,(size_t)&local_c0,0x55a,
             (lazy_ostream *)local_58,"\"foo\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x55b;
  file_19.m_begin = (iterator)&local_460;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_470,
             msg_19);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,",bar");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ",bar";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae998;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x55b,
             (lazy_ostream *)local_58,"\",bar\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x11;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"(aaaaa,bbbbb()),c",0x11);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_100);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x560;
  file_20.m_begin = (iterator)&local_480;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_490,
             msg_20);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"(aaaaa,bbbbb())");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "(aaaaa,bbbbb())";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013af8b0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79d23,(size_t)&local_c0,0x560,
             (lazy_ostream *)local_58,"\"(aaaaa,bbbbb())\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x561;
  file_21.m_begin = (iterator)&local_4a0;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4b0,
             msg_21);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,",c");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ",c";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013af7f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x561,
             (lazy_ostream *)local_58,"\",c\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x7;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"xyz)foo",7);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_100);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x566;
  file_22.m_begin = (iterator)&local_4c0;
  msg_22.m_end = pvVar10;
  msg_22.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4d0,
             msg_22);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"xyz");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "xyz";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae898;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79d23,(size_t)&local_c0,0x566,
             (lazy_ostream *)local_58,"\"xyz\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x567;
  file_23.m_begin = (iterator)&local_4e0;
  msg_23.m_end = pvVar11;
  msg_23.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_4f0,
             msg_23);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,")foo");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ")foo";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae998;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x567,
             (lazy_ostream *)local_58,"\")foo\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x11;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"((a),(b),(c)),xxx",0x11);
  local_100.m_data = input._M_dataplus._M_p;
  local_100.m_size = input._M_string_length;
  SVar12 = ::script::Expr(&local_100);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x56c;
  file_24.m_begin = (iterator)&local_500;
  msg_24.m_end = pvVar10;
  msg_24.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_510,
             msg_24);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,SVar12.m_data,SVar12.m_data + SVar12.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"((a),(b),(c))");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "((a),(b),(c))";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013b1640;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79d23,(size_t)&local_c0,0x56c,
             (lazy_ostream *)local_58,"\"((a),(b),(c))\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x56d;
  file_25.m_begin = (iterator)&local_520;
  msg_25.m_end = pvVar11;
  msg_25.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_530,
             msg_25);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,local_100.m_data,local_100.m_data + local_100.m_size);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,",xxx");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = ",xxx";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae998;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79c7f,(size_t)&local_c0,0x56d,
             (lazy_ostream *)local_58,"\",xxx\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"xxx",3);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_170[0] = 0x78;
  separators._M_str = pvVar11;
  separators._M_len = (size_t)local_170;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators);
  uVar5 = local_48._M_allocated_capacity;
  uVar3 = local_58._8_8_;
  uVar2 = local_58._0_8_;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_538 = "";
  local_554._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_554._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x574;
  file_26.m_begin = (iterator)&local_540;
  msg_26.m_end = pvVar10;
  msg_26.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)(local_554 + 4),
             msg_26);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_f0 = (char *)((long)(uVar3 - uVar2) >> 4);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_554;
  local_554._0_4_ = 4;
  local_98._M_dataplus._M_p._0_1_ = uVar3 - uVar2 == 0x40;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf730f4;
  local_c0 = &local_f0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_170,1,2,REQUIRE,0xe72b94,
             (size_t)&local_b0,0x574,local_58,"4U",(util *)&local_e8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x575;
  file_27.m_begin = (iterator)&local_568;
  msg_27.m_end = pvVar11;
  msg_27.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_578,
             msg_27);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar2,
             *(undefined **)(uVar2 + 8) + (long)*(undefined **)uVar2);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79dd7,(size_t)&local_c0,0x575,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x576;
  file_28.m_begin = (iterator)&local_588;
  msg_28.m_end = pvVar11;
  msg_28.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_598,
             msg_28);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x10),
             *(undefined **)(uVar2 + 0x18) + (long)*(undefined **)(uVar2 + 0x10));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79ded,(size_t)&local_c0,0x576,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x577;
  file_29.m_begin = (iterator)&local_5a8;
  msg_29.m_end = pvVar11;
  msg_29.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_5b8,
             msg_29);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x20),
             *(undefined **)(uVar2 + 0x28) + (long)*(undefined **)(uVar2 + 0x20));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79e03,(size_t)&local_c0,0x577,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x578;
  file_30.m_begin = (iterator)&local_5c8;
  msg_30.m_end = pvVar11;
  msg_30.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_5d8,
             msg_30);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x30),
             *(undefined **)(uVar2 + 0x38) + (long)*(undefined **)(uVar2 + 0x30));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79e19,(size_t)&local_c0,0x578,
             local_58,"\"\"",(util *)&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0xd;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"one#two#three",0xd);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_170[0] = 0x2d;
  separators_00._M_str = pvVar11;
  separators_00._M_len = (size_t)local_170;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators_00);
  uVar6 = local_48._M_allocated_capacity;
  uVar4 = local_58._8_8_;
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  operator_delete((void *)uVar2,uVar5 - uVar2);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x57c;
  file_31.m_begin = (iterator)&local_5e8;
  msg_31.m_end = pvVar10;
  msg_31.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_5f8,
             msg_31);
  local_f0 = (char *)((long)(uVar4 - uVar3) >> 4);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_98._M_dataplus._M_p._0_1_ = uVar4 - uVar3 == 0x10;
  local_554._0_4_ = 1;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf730f4;
  local_c0 = &local_f0;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_554;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_170,1,2,REQUIRE,0xe72b94,
             (size_t)&local_b0,0x57c,local_58,"1U",&local_e8);
  paVar1 = &local_98.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar1->_M_allocated_capacity);
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x57d;
  file_32.m_begin = (iterator)&local_608;
  msg_32.m_end = pvVar11;
  msg_32.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_618,
             msg_32);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar3,
             *(undefined **)(uVar3 + 8) + (long)*(undefined **)uVar3);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"one#two#three");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "one#two#three";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013b1640;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79dd7,(size_t)&local_c0,0x57d,
             local_58,"\"one#two#three\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0xd;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"one#two#three",0xd);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_170[0] = 0x23;
  separators_01._M_str = pvVar11;
  separators_01._M_len = (size_t)local_170;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators_01);
  uVar4 = local_48._M_allocated_capacity;
  uVar5 = local_58._8_8_;
  uVar2 = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  operator_delete((void *)uVar3,uVar6 - uVar3);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x581;
  file_33.m_begin = (iterator)&local_628;
  msg_33.m_end = pvVar10;
  msg_33.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_638,
             msg_33);
  local_f0 = (char *)((long)(uVar5 - uVar2) >> 4);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_98._M_dataplus._M_p._0_1_ = uVar5 - uVar2 == 0x30;
  local_554._0_4_ = 3;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf730f4;
  local_c0 = &local_f0;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_554;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_170,1,2,REQUIRE,0xe72b94,
             (size_t)&local_b0,0x581,local_58,"3U",&local_e8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x582;
  file_34.m_begin = (iterator)&local_648;
  msg_34.m_end = pvVar11;
  msg_34.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_658,
             msg_34);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar2,
             *(undefined **)(uVar2 + 8) + (long)*(undefined **)uVar2);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"one");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "one";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae898;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79dd7,(size_t)&local_c0,0x582,
             local_58,"\"one\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x583;
  file_35.m_begin = (iterator)&local_668;
  msg_35.m_end = pvVar11;
  msg_35.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_678,
             msg_35);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x10),
             *(undefined **)(uVar2 + 0x18) + (long)*(undefined **)(uVar2 + 0x10));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"two");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "two";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae898;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79ded,(size_t)&local_c0,0x583,
             local_58,"\"two\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x584;
  file_36.m_begin = (iterator)&local_688;
  msg_36.m_end = pvVar11;
  msg_36.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_698,
             msg_36);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar2 + 0x20),
             *(undefined **)(uVar2 + 0x28) + (long)*(undefined **)(uVar2 + 0x20));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"three");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "three";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae618;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79e03,(size_t)&local_c0,0x584,
             local_58,"\"three\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pvVar11 = (iterator)0x9;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&input,0,input._M_string_length,"*foo*bar*",9);
  local_e8._0_8_ = input._M_dataplus._M_p;
  local_e8.m_message.px = (element_type *)input._M_string_length;
  local_170[0] = 0x2a;
  separators_02._M_str = pvVar11;
  separators_02._M_len = (size_t)local_170;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)local_58,
             (util *)&local_e8,(Span<const_char> *)0x1,separators_02);
  uVar6 = local_48._M_allocated_capacity;
  uVar5 = local_58._8_8_;
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  operator_delete((void *)uVar2,uVar4 - uVar2);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity - local_58._0_8_);
  }
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x588;
  file_37.m_begin = (iterator)&local_6a8;
  msg_37.m_end = pvVar10;
  msg_37.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_6b8,
             msg_37);
  local_f0 = (char *)((long)(uVar5 - uVar3) >> 4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_554;
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_554._0_4_ = 4;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_98._M_dataplus._M_p._0_1_ = uVar5 - uVar3 == 0x40;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0.m_message.px = (element_type *)0xf730f4;
  local_c0 = &local_f0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_c8;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_48._8_8_ = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)local_170,1,2,REQUIRE,0xe72b94,
             (size_t)&local_b0,0x588,local_58,"4U",&local_e8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_98.field_2._M_allocated_capacity);
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x589;
  file_38.m_begin = (iterator)&local_6c8;
  msg_38.m_end = pvVar11;
  msg_38.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_6d8,
             msg_38);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)uVar3,
             *(undefined **)(uVar3 + 8) + (long)*(undefined **)uVar3);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79dd7,(size_t)&local_c0,0x589,
             local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x58a;
  file_39.m_begin = (iterator)&local_6e8;
  msg_39.m_end = pvVar11;
  msg_39.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_6f8,
             msg_39);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar3 + 0x10),
             *(undefined **)(uVar3 + 0x18) + (long)*(undefined **)(uVar3 + 0x10));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"foo");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "foo";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae898;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79ded,(size_t)&local_c0,0x58a,
             local_58,"\"foo\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x58b;
  file_40.m_begin = (iterator)&local_708;
  msg_40.m_end = pvVar11;
  msg_40.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_718,
             msg_40);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar3 + 0x20),
             *(undefined **)(uVar3 + 0x28) + (long)*(undefined **)(uVar3 + 0x20));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"bar");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "bar";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae898;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79e03,(size_t)&local_c0,0x58b,
             local_58,"\"bar\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x58c;
  file_41.m_begin = (iterator)&local_728;
  msg_41.m_end = pvVar11;
  msg_41.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_738,
             msg_41);
  local_170._8_8_ = local_170._8_8_ & 0xffffffffffffff00;
  local_170._0_8_ = &PTR__lazy_ostream_013ae088;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,*(undefined **)(uVar3 + 0x30),
             *(undefined **)(uVar3 + 0x38) + (long)*(undefined **)(uVar3 + 0x30));
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)0xf73098;
  local_b8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_c8;
  local_f0 = "";
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae6d8;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_f0;
  local_c8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,(lazy_ostream *)local_170,1,2,REQUIRE,0xf79e19,(size_t)&local_c0,0x58c,
             local_58,"\"\"",&local_e8);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  operator_delete((void *)uVar3,uVar6 - uVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input._M_dataplus._M_p != &input.field_2) {
    operator_delete(input._M_dataplus._M_p,
                    CONCAT71(input.field_2._M_allocated_capacity._1_7_,input.field_2._M_local_buf[0]
                            ) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_script_parsing)
{
    using namespace script;
    std::string input;
    Span<const char> sp;
    bool success;

    // Const(...): parse a constant, update span to skip it if successful
    input = "MilkToastHoney";
    sp = input;
    success = Const("", sp); // empty
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "MilkToastHoney");

    success = Const("Milk", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "ToastHoney");

    success = Const("Bread", sp);
    BOOST_CHECK(!success);

    success = Const("Toast", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "Honey");

    success = Const("Honeybadger", sp);
    BOOST_CHECK(!success);

    success = Const("Honey", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "");

    // Func(...): parse a function call, update span to argument if successful
    input = "Foo(Bar(xy,z()))";
    sp = input;

    success = Func("FooBar", sp);
    BOOST_CHECK(!success);

    success = Func("Foo(", sp);
    BOOST_CHECK(!success);

    success = Func("Foo", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "Bar(xy,z())");

    success = Func("Bar", sp);
    BOOST_CHECK(success);
    BOOST_CHECK_EQUAL(SpanToStr(sp), "xy,z()");

    success = Func("xy", sp);
    BOOST_CHECK(!success);

    // Expr(...): return expression that span begins with, update span to skip it
    Span<const char> result;

    input = "(n*(n-1))/2";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "(n*(n-1))/2");
    BOOST_CHECK_EQUAL(SpanToStr(sp), "");

    input = "foo,bar";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "foo");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",bar");

    input = "(aaaaa,bbbbb()),c";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "(aaaaa,bbbbb())");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",c");

    input = "xyz)foo";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "xyz");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ")foo");

    input = "((a),(b),(c)),xxx";
    sp = input;
    result = Expr(sp);
    BOOST_CHECK_EQUAL(SpanToStr(result), "((a),(b),(c))");
    BOOST_CHECK_EQUAL(SpanToStr(sp), ",xxx");

    // Split(...): split a string on every instance of sep, return vector
    std::vector<Span<const char>> results;

    input = "xxx";
    results = Split(input, 'x');
    BOOST_CHECK_EQUAL(results.size(), 4U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[3]), "");

    input = "one#two#three";
    results = Split(input, '-');
    BOOST_CHECK_EQUAL(results.size(), 1U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "one#two#three");

    input = "one#two#three";
    results = Split(input, '#');
    BOOST_CHECK_EQUAL(results.size(), 3U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "one");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "two");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "three");

    input = "*foo*bar*";
    results = Split(input, '*');
    BOOST_CHECK_EQUAL(results.size(), 4U);
    BOOST_CHECK_EQUAL(SpanToStr(results[0]), "");
    BOOST_CHECK_EQUAL(SpanToStr(results[1]), "foo");
    BOOST_CHECK_EQUAL(SpanToStr(results[2]), "bar");
    BOOST_CHECK_EQUAL(SpanToStr(results[3]), "");
}